

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall cimg_library::CImgDisplay::_paint(CImgDisplay *this,bool wait_expose)

{
  Display *pDVar1;
  X11_info *pXVar2;
  byte in_SIL;
  CImgDisplay *in_RDI;
  GC gc;
  Display *dpy;
  
  if (((in_RDI->_is_closed & 1U) == 0) && (in_RDI->_image != (XImage *)0x0)) {
    pXVar2 = cimg::X11_attr();
    pDVar1 = pXVar2->display;
    if ((in_SIL & 1) == 0) {
      XPutImage(pDVar1,in_RDI->_window,
                *(undefined8 *)
                 (*(long *)(pDVar1 + 0xe8) + (long)*(int *)(pDVar1 + 0xe0) * 0x80 + 0x48),
                in_RDI->_image,0,0,0,0,in_RDI->_width,in_RDI->_height);
    }
    else {
      _paint::event.type = 0xc;
      _paint::event.xany.serial = 0;
      _paint::event.xany.send_event = 1;
      _paint::event.xany.window = in_RDI->_window;
      _paint::event.xfocus.mode = 0;
      _paint::event.xfocus.detail = 0;
      _paint::event.xerror.serial = (unsigned_long)pDVar1;
      _paint::event.xexpose.width = width(in_RDI);
      _paint::event.xexpose.height = height(in_RDI);
      _paint::event.xexpose.count = 0;
      XSendEvent(pDVar1,in_RDI->_window,0,0,&_paint::event);
    }
  }
  return;
}

Assistant:

void _paint(const bool wait_expose=true) {
      if (_is_closed || !_image) return;
      Display *const dpy = cimg::X11_attr().display;
      if (wait_expose) { // Send an expose event sticked to display window to force repaint.
        static XEvent event;
        event.xexpose.type = Expose;
        event.xexpose.serial = 0;
        event.xexpose.send_event = True;
        event.xexpose.display = dpy;
        event.xexpose.window = _window;
        event.xexpose.x = 0;
        event.xexpose.y = 0;
        event.xexpose.width = width();
        event.xexpose.height = height();
        event.xexpose.count = 0;
        XSendEvent(dpy,_window,False,0,&event);
      } else { // Repaint directly (may be called from the expose event).
        GC gc = DefaultGC(dpy,DefaultScreen(dpy));
#ifdef cimg_use_xshm
        if (_shminfo) {
          const int completion_type = XShmGetEventBase(dpy) + ShmCompletion;
          XEvent event;
          XShmPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height,True);
          do { XNextEvent(dpy,&event); } while (event.type!=completion_type);  // Wait for the image drawing to be completed.
        } else XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#else
        XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#endif
      }
    }